

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O1

void ans_fold_decompress<7u>(uint32_t *dst,size_t to_decode,uint8_t *cSrc,size_t cSrcSize)

{
  size_t sVar1;
  uint32_t uVar2;
  size_t sVar3;
  uint8_t *in_u8;
  array<unsigned_long,_4UL> states;
  ans_fold_decode<7U> ans_frame;
  long *local_b0;
  uint64_t local_a8;
  uint64_t local_a0;
  uint64_t local_98;
  uint64_t local_90;
  size_t local_88;
  ans_fold_decode<7U> local_80;
  
  local_b0 = (long *)cSrc;
  ans_fold_decode<7U>::load(&local_80,cSrc);
  local_90 = *(long *)((long)local_b0 + (cSrcSize - 8)) + local_80.lower_bound;
  local_98 = *(long *)((long)local_b0 + (cSrcSize - 0x10)) + local_80.lower_bound;
  local_a0 = *(long *)((long)local_b0 + (cSrcSize - 0x18)) + local_80.lower_bound;
  local_b0 = (long *)((long)local_b0 + (cSrcSize - 0x20));
  local_a8 = local_80.lower_bound + *local_b0;
  sVar3 = 0;
  local_88 = to_decode;
  if ((to_decode & 0xfffffffffffffffc) != 0) {
    do {
      uVar2 = ans_fold_decode<7U>::decode_sym(&local_80,&local_90,(uint8_t **)&local_b0);
      dst[sVar3] = uVar2;
      uVar2 = ans_fold_decode<7U>::decode_sym(&local_80,&local_98,(uint8_t **)&local_b0);
      dst[sVar3 + 1] = uVar2;
      uVar2 = ans_fold_decode<7U>::decode_sym(&local_80,&local_a0,(uint8_t **)&local_b0);
      dst[sVar3 + 2] = uVar2;
      uVar2 = ans_fold_decode<7U>::decode_sym(&local_80,&local_a8,(uint8_t **)&local_b0);
      dst[sVar3 + 3] = uVar2;
      sVar3 = sVar3 + 4;
    } while ((to_decode & 0xfffffffffffffffc) != sVar3);
  }
  sVar1 = local_88;
  if (sVar3 != local_88) {
    do {
      uVar2 = ans_fold_decode<7U>::decode_sym(&local_80,&local_a8,(uint8_t **)&local_b0);
      dst[sVar3] = uVar2;
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  if (local_80.table.super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.table.
                    super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.table.
                          super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.table.
                          super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ans_fold_decompress(
    uint32_t* dst, size_t to_decode, const uint8_t* cSrc, size_t cSrcSize)
{
    auto in_u8 = reinterpret_cast<const uint8_t*>(cSrc);
    auto ans_frame = ans_fold_decode<fidelity>::load(in_u8);
    in_u8 += cSrcSize;

    std::array<uint64_t, 4> states;
    states[3] = ans_frame.init_state(in_u8);
    states[2] = ans_frame.init_state(in_u8);
    states[1] = ans_frame.init_state(in_u8);
    states[0] = ans_frame.init_state(in_u8);

    size_t cur_idx = 0;
    auto out_u32 = reinterpret_cast<uint32_t*>(dst);
    size_t fast_decode = to_decode - (to_decode % 4);
    while (cur_idx != fast_decode) {
        out_u32[cur_idx] = ans_frame.decode_sym(states[3], in_u8);
        out_u32[cur_idx + 1] = ans_frame.decode_sym(states[2], in_u8);
        out_u32[cur_idx + 2] = ans_frame.decode_sym(states[1], in_u8);
        out_u32[cur_idx + 3] = ans_frame.decode_sym(states[0], in_u8);
        cur_idx += 4;
    }
    while (cur_idx != to_decode) {
        out_u32[cur_idx] = ans_frame.decode_sym(states[0], in_u8);
        cur_idx++;
    }
}